

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O0

void __thiscall
chrono::ChClassRegistration<myEmployeeBoss>::ChClassRegistration
          (ChClassRegistration<myEmployeeBoss> *this,char *mtag_name)

{
  char *mtag_name_local;
  ChClassRegistration<myEmployeeBoss> *this_local;
  
  ChClassRegistrationBase::ChClassRegistrationBase(&this->super_ChClassRegistrationBase);
  (this->super_ChClassRegistrationBase)._vptr_ChClassRegistrationBase =
       (_func_int **)&PTR_create_001d76d0;
  std::__cxx11::string::string((string *)&this->m_sTagName);
  std::__cxx11::string::operator=((string *)&this->m_sTagName,mtag_name);
  ChClassFactory::ClassRegister(&this->m_sTagName,&this->super_ChClassRegistrationBase);
  return;
}

Assistant:

ChClassRegistration(const char* mtag_name) {
        // set name using the 'fake' RTTI system of Chrono
        this->m_sTagName = mtag_name; //t::FactoryClassNameTag();

        // register in global class factory
        ChClassFactory::ClassRegister(this->m_sTagName, this);
    }